

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O2

UBool changesWhenNFKC_Casefolded(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  UBool UVar1;
  int iVar2;
  Normalizer2Impl *this;
  bool bVar3;
  UErrorCode errorCode;
  UnicodeString src;
  ReorderingBuffer buffer;
  UnicodeString dest;
  
  errorCode = U_ZERO_ERROR;
  this = icu_63::Normalizer2Factory::getNFKC_CFImpl(&errorCode);
  if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::UnicodeString::UnicodeString(&src,c);
    buffer.str = &dest;
    dest.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b1268;
    dest.fUnion.fStackFields.fLengthAndFlags = 2;
    buffer.start = (UChar *)0x0;
    buffer.reorderStart._0_5_ = 0;
    buffer.reorderStart._5_3_ = 0;
    buffer.limit._0_5_ = 0;
    buffer._37_8_ = 0;
    buffer.impl = this;
    iVar2 = icu_63::ReorderingBuffer::init(&buffer,(EVP_PKEY_CTX *)0x5);
    if ((char)iVar2 != '\0') {
      if ((src.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
        if ((src.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          src.fUnion.fFields.fArray = src.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        src.fUnion.fFields.fArray = (char16_t *)0x0;
      }
      if (-1 < src.fUnion.fStackFields.fLengthAndFlags) {
        src.fUnion.fFields.fLength = (int)src.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      icu_63::Normalizer2Impl::compose
                (this,src.fUnion.fFields.fArray,
                 (char16_t *)
                 ((long)src.fUnion.fFields.fArray + (long)src.fUnion.fFields.fLength * 2),'\0',
                 '\x01',&buffer,&errorCode);
    }
    icu_63::ReorderingBuffer::~ReorderingBuffer(&buffer);
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      UVar1 = icu_63::UnicodeString::operator!=(&dest,&src);
      bVar3 = UVar1 != '\0';
    }
    else {
      bVar3 = false;
    }
    icu_63::UnicodeString::~UnicodeString(&dest);
    icu_63::UnicodeString::~UnicodeString(&src);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static UBool changesWhenNFKC_Casefolded(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *kcf=Normalizer2Factory::getNFKC_CFImpl(errorCode);
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    UnicodeString src(c);
    UnicodeString dest;
    {
        // The ReorderingBuffer must be in a block because its destructor
        // needs to release dest's buffer before we look at its contents.
        ReorderingBuffer buffer(*kcf, dest);
        // Small destCapacity for NFKC_CF(c).
        if(buffer.init(5, errorCode)) {
            const UChar *srcArray=src.getBuffer();
            kcf->compose(srcArray, srcArray+src.length(), FALSE,
                          TRUE, buffer, errorCode);
        }
    }
    return U_SUCCESS(errorCode) && dest!=src;
}